

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Bdd __thiscall
sylvan::Bdd::Permute
          (Bdd *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *from,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *to)

{
  uint32_t key;
  BDD BVar1;
  long *in_RCX;
  long lVar2;
  BDDMAP extraout_RDX;
  BDDMAP arg_2;
  BDDMAP extraout_RDX_00;
  ulong uVar3;
  BddMap map;
  BddMap local_48;
  Bdd local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_38 = from;
  BddMap::BddMap(&local_48);
  lVar2 = 0x2002;
  uVar3 = (ulong)(*(long *)(to + 8) - *(long *)to) >> 2 & 0xffffffff;
  arg_2 = extraout_RDX;
  while( true ) {
    uVar3 = uVar3 - 1;
    if ((int)(uint)uVar3 < 0) break;
    lVar2 = (ulong)((uint)uVar3 & 0x7fffffff) * 4;
    key = *(uint32_t *)(*(long *)to + lVar2);
    bddVar(&local_40,*(uint32_t *)(*in_RCX + lVar2));
    local_48.bdd = mtbdd_map_add(local_48.bdd,key,local_40.bdd);
    ~Bdd(&local_40);
    arg_2 = extraout_RDX_00;
  }
  BVar1 = sylvan_compose_RUN(*(sylvan **)local_38,local_48.bdd,arg_2,(BDDVAR)lVar2);
  this->bdd = BVar1;
  mtbdd_protect(&this->bdd);
  BddMap::~BddMap(&local_48);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::Permute(const std::vector<uint32_t>& from, const std::vector<uint32_t>& to) const
{
    /* Create a map */
    BddMap map;
    for (int i=from.size()-1; i>=0; i--) {
        map.put(from[i], Bdd::bddVar(to[i]));
    }

    return sylvan_compose(bdd, map.bdd);
}